

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O1

bool __thiscall
soul::ResolutionPass::GenericFunctionResolver::findGenericFunctionTypes
          (GenericFunctionResolver *this,CallOrCast *call,Function *function,
          ArrayView<soul::Type> callerArgumentTypes,TypeArray *resolvedTypes,bool shouldIgnoreErrors
          )

{
  StructurePtr o;
  bool bVar1;
  pointer ppVar2;
  long *plVar3;
  Identifier *name;
  Expression *extraout_RDX;
  Expression *paramType;
  Expression *extraout_RDX_00;
  Expression *extraout_RDX_01;
  ulong uVar4;
  Type *callerArgumentType;
  size_type *psVar5;
  ulong uVar6;
  bool bVar7;
  bool anyReferencesInvolved;
  Identifier wildcardName;
  Type resolvedType;
  bool local_fa;
  bool local_f9;
  string local_f8;
  string local_d8;
  Type local_b8;
  Identifier local_a0;
  Type local_98;
  CallOrCast *local_80;
  _func_int **local_78;
  TypeArray *local_70;
  Type *local_68;
  Expression *local_60;
  Expression *local_58;
  string local_50;
  
  local_68 = callerArgumentTypes.s;
  local_58 = (Expression *)
             (function->genericWildcards).
             super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  paramType = (Expression *)
              (function->genericWildcards).
              super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_fa = local_58 == paramType;
  if (!local_fa) {
    uVar4 = ((long)callerArgumentTypes.e - (long)local_68 >> 3) * -0x5555555555555555;
    local_80 = call;
    local_70 = resolvedTypes;
    local_60 = paramType;
    do {
      local_78 = (local_58->super_Statement).super_ASTObject._vptr_ASTObject;
      local_a0.name = (string *)local_78[6];
      local_98.category = invalid;
      local_98.arrayElementCategory = invalid;
      local_98.isRef = false;
      local_98.isConstant = false;
      local_98.primitiveType.type = invalid;
      local_98.boundingSize = 0;
      local_98.arrayElementBoundingSize = 0;
      local_98.structure.object = (Structure *)0x0;
      ppVar2 = (function->parameters).
               super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar7 = (function->parameters).
              super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
              ._M_impl.super__Vector_impl_data._M_finish != ppVar2;
      if (bVar7) {
        uVar6 = 0;
        callerArgumentType = local_68;
        do {
          paramType = ((ppVar2[uVar6].object)->declaredType).object;
          if (paramType != (Expression *)0x0) {
            local_f9 = false;
            if (uVar4 < uVar6 || uVar4 - uVar6 == 0) {
              throwInternalCompilerError("i < size()","operator[]",0xc4);
            }
            matchParameterAgainstWildcard
                      (&local_b8,this,paramType,callerArgumentType,&local_a0,&local_f9);
            if (local_b8.category != invalid) {
              if (local_b8.isRef == false) {
                if (local_b8.structure.object != (Structure *)0x0) {
                  ((local_b8.structure.object)->super_RefCountedObject).refCount =
                       ((local_b8.structure.object)->super_RefCountedObject).refCount + 1;
                }
                local_b8.isRef = false;
                local_b8.isConstant = false;
                RefCountedPtr<soul::Structure>::decIfNotNull(local_b8.structure.object);
              }
              o.object = local_98.structure.object;
              if (local_98.category == invalid) {
                local_98.arrayElementCategory = local_b8.arrayElementCategory;
                local_98.category = local_b8.category;
                local_98.isRef = local_b8.isRef;
                local_98.isConstant = local_b8.isConstant;
                local_98.primitiveType.type = local_b8.primitiveType.type;
                local_98.boundingSize = local_b8.boundingSize;
                local_98.arrayElementBoundingSize = local_b8.arrayElementBoundingSize;
                if (local_b8.structure.object != (Structure *)0x0) {
                  ((local_b8.structure.object)->super_RefCountedObject).refCount =
                       ((local_b8.structure.object)->super_RefCountedObject).refCount + 1;
                }
                local_98.structure.object = local_b8.structure.object;
                RefCountedPtr<soul::Structure>::decIfNotNull(o.object);
              }
              else {
                bVar1 = Type::isEqual(&local_b8,&local_98,0);
                if (!bVar1) {
                  if (!shouldIgnoreErrors) {
                    quoteName_abi_cxx11_(&local_50,(soul *)&local_a0,name);
                    plVar3 = (long *)std::__cxx11::string::replace
                                               ((ulong)&local_50,0,(char *)0x0,0x286b66);
                    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
                    psVar5 = (size_type *)(plVar3 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar3 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar5) {
                      local_d8.field_2._M_allocated_capacity = *psVar5;
                      local_d8.field_2._8_8_ = plVar3[3];
                    }
                    else {
                      local_d8.field_2._M_allocated_capacity = *psVar5;
                      local_d8._M_dataplus._M_p = (pointer)*plVar3;
                    }
                    local_d8._M_string_length = plVar3[1];
                    *plVar3 = (long)psVar5;
                    plVar3[1] = 0;
                    *(undefined1 *)(plVar3 + 2) = 0;
                    plVar3 = (long *)std::__cxx11::string::append((char *)&local_d8);
                    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
                    psVar5 = (size_type *)(plVar3 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar3 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar5) {
                      local_f8.field_2._M_allocated_capacity = *psVar5;
                      local_f8.field_2._8_8_ = plVar3[3];
                    }
                    else {
                      local_f8.field_2._M_allocated_capacity = *psVar5;
                      local_f8._M_dataplus._M_p = (pointer)*plVar3;
                    }
                    local_f8._M_string_length = plVar3[1];
                    *plVar3 = (long)psVar5;
                    plVar3[1] = 0;
                    *(undefined1 *)(plVar3 + 2) = 0;
                    throwResolutionError(this,local_80,function,(Context *)(local_78 + 2),&local_f8)
                    ;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
                      operator_delete(local_f8._M_dataplus._M_p,
                                      local_f8.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                      operator_delete(local_d8._M_dataplus._M_p,
                                      local_d8.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_50._M_dataplus._M_p != &local_50.field_2) {
                      operator_delete(local_50._M_dataplus._M_p,
                                      local_50.field_2._M_allocated_capacity + 1);
                    }
                  }
                  RefCountedPtr<soul::Structure>::decIfNotNull(local_b8.structure.object);
                  paramType = extraout_RDX_00;
                  if (bVar7) goto LAB_00206587;
                  break;
                }
              }
            }
            RefCountedPtr<soul::Structure>::decIfNotNull(local_b8.structure.object);
            paramType = extraout_RDX;
          }
          uVar6 = uVar6 + 1;
          ppVar2 = (function->parameters).
                   super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          callerArgumentType = callerArgumentType + 1;
          bVar7 = uVar6 < (ulong)((long)(function->parameters).
                                        super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar2 >>
                                 3);
        } while (bVar7);
      }
      if (local_98.category == invalid) {
        if (!shouldIgnoreErrors) {
          quoteName_abi_cxx11_(&local_d8,(soul *)&local_a0,(Identifier *)paramType);
          plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,0x286ba5);
          psVar5 = (size_type *)(plVar3 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar3 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar5) {
            local_f8.field_2._M_allocated_capacity = *psVar5;
            local_f8.field_2._8_8_ = plVar3[3];
            local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          }
          else {
            local_f8.field_2._M_allocated_capacity = *psVar5;
            local_f8._M_dataplus._M_p = (pointer)*plVar3;
          }
          local_f8._M_string_length = plVar3[1];
          *plVar3 = (long)psVar5;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          throwResolutionError(this,local_80,function,(Context *)(local_78 + 2),&local_f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          }
        }
LAB_00206587:
        bVar7 = false;
      }
      else {
        bVar7 = true;
        ArrayWithPreallocation<soul::Type,_8UL>::push_back(local_70,&local_98);
      }
      RefCountedPtr<soul::Structure>::decIfNotNull(local_98.structure.object);
      if (!bVar7) {
        return local_fa;
      }
      local_58 = (Expression *)&(local_58->super_Statement).super_ASTObject.objectType;
      local_fa = local_58 == local_60;
      paramType = extraout_RDX_01;
    } while (!local_fa);
  }
  return local_fa;
}

Assistant:

bool findGenericFunctionTypes (AST::CallOrCast& call, AST::Function& function, ArrayView<Type> callerArgumentTypes, AST::TypeArray& resolvedTypes, bool shouldIgnoreErrors)
        {
            for (auto wildcardToResolve : function.genericWildcards)
            {
                auto wildcardName = wildcardToResolve->identifier;
                Type resolvedType;

                for (size_t i = 0; i < function.parameters.size(); ++i)
                {
                    if (auto paramType = function.parameters[i]->declaredType)
                    {
                        bool anyReferencesInvolved = false;
                        auto newMatch = matchParameterAgainstWildcard (*paramType, callerArgumentTypes[i], wildcardName, anyReferencesInvolved);

                        if (newMatch.isValid())
                        {
                            if (! newMatch.isReference())
                                newMatch = newMatch.removeConstIfPresent();

                            if (resolvedType.isValid())
                            {
                                if (! newMatch.isIdentical (resolvedType))
                                {
                                    if (! shouldIgnoreErrors)
                                        throwResolutionError (call, function, wildcardToResolve->context,
                                                              "Could not find a value for " + quoteName (wildcardName) + " that satisfies all argument types");

                                    return false;
                                }
                            }
                            else
                            {
                                resolvedType = newMatch;
                            }
                        }
                    }
                }

                if (! resolvedType.isValid())
                {
                    if (! shouldIgnoreErrors)
                        throwResolutionError (call, function, wildcardToResolve->context,
                                              "Failed to resolve generic parameter " + quoteName (wildcardName));
                    return false;
                }

                resolvedTypes.push_back (resolvedType);
            }

            return true;
        }